

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btInternalEdge>::~btAlignedObjectArray
          (btAlignedObjectArray<btInternalEdge> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}